

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

int linux_eventfd_init(eventfd *efd,filter *filt)

{
  int iVar1;
  undefined8 in_RSI;
  int *in_RDI;
  int evfd;
  int local_4;
  
  iVar1 = eventfd(0,0x80800);
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else {
    *in_RDI = iVar1;
    *(undefined8 *)(in_RDI + 2) = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
linux_eventfd_init(struct eventfd *efd, struct filter *filt)
{
    int evfd;

    evfd = eventfd(0, EFD_NONBLOCK | EFD_CLOEXEC);
    if (evfd < 0) {
        dbg_perror("eventfd");
        return (-1);
    }
    dbg_printf("eventfd=%i - created", evfd);
    efd->ef_id = evfd;
    efd->ef_filt = filt;

    return (0);
}